

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O2

double __thiscall
Kriging::_logMargPost
          (Kriging *this,vec *_theta,vec *grad_out,KModel *model,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *bench)

{
  vec *pvVar1;
  double dVar2;
  double dVar3;
  result rVar4;
  result rVar5;
  double dVar6;
  Mat<double> *__x;
  elem_type eVar7;
  uint extraout_EAX;
  uint uVar8;
  uword extraout_EAX_00;
  time_point tVar9;
  Mat<double> *in_mat;
  undefined8 extraout_RAX;
  int iVar10;
  uword uVar11;
  uword extraout_EDX;
  uword A_n_rows;
  uword extraout_EDX_00;
  uword i;
  uint uVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  ulong uVar15;
  uword j;
  uint uVar16;
  uword k;
  uint uVar17;
  double dVar18;
  double dVar19;
  Mat<double> *pMVar20;
  char *in_stack_ffffffffffffe888;
  mat Wb_k;
  undefined1 local_1628 [16];
  Op<arma::Mat<double>,_arma::op_htrans> *local_1618;
  undefined1 local_15e8 [40];
  Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> local_15c0;
  string local_15a8;
  string local_1588;
  string local_1568;
  string local_1548;
  string local_1528;
  string local_1508;
  undefined1 local_14e8 [12];
  uint uStack_14dc;
  undefined8 local_14d8;
  double dStack_14d0;
  uword local_14c8;
  uword local_14c4;
  undefined1 local_1438 [12];
  uint uStack_142c;
  Mat<double> *local_1428;
  undefined8 uStack_1420;
  undefined1 local_1418 [148];
  uword local_1384;
  uint local_1368;
  uword local_1358;
  Mat<double> local_1338;
  undefined1 local_1288 [176];
  mat gradR_k;
  string local_1128;
  cube gradR;
  vec CL;
  Op<arma::Mat<double>,_arma::op_htrans> local_dd8;
  vec ans;
  string local_ce8;
  string local_cc8;
  undefined1 local_ca8 [176];
  mat S_2;
  mat Q_output;
  mat yt_Rinv;
  mat LX;
  mat Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
  Mat<double> local_888;
  mat Xt_Rinv_X;
  mat Rinv_X;
  KModel m;
  
  make_Model(&m,this,_theta,bench);
  if (model != (KModel *)0x0) {
    KModel::operator=(model,&m);
  }
  uVar8 = (this->m_X).n_rows;
  uVar12 = (this->m_X).n_cols;
  uVar13 = (ulong)uVar12;
  uVar11 = (this->m_F).n_cols;
  tVar9 = Bench::tic();
  local_1438._0_8_ = &m.L;
  arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
            ((Mat<double> *)&gradR,(Op<arma::Mat<double>,_arma::op_htrans> *)local_1438);
  LinearAlgebra::solve(&Rinv_X,(mat *)&gradR,&m.Fstar);
  arma::Mat<double>::~Mat((Mat<double> *)&gradR);
  local_1438._0_8_ = &gradR;
  unique0x1000196d = &Rinv_X;
  gradR._0_8_ = &this->m_F;
  arma::Mat<double>::
  Mat<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Mat<double>,arma::glue_times>
            (&Xt_Rinv_X,
             (Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>
              *)local_1438);
  arma::Mat<double>::Mat(&local_888,&Xt_Rinv_X);
  LinearAlgebra::safe_chol_lower(&LX,&local_888);
  arma::Mat<double>::~Mat(&local_888);
  CL.super_Mat<double>._0_8_ = &LX;
  arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
            ((Mat<double> *)local_1438,(Op<arma::Mat<double>,_arma::op_htrans> *)&CL);
  ans.super_Mat<double>._0_8_ = &Rinv_X;
  arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
            (&S_2,(Op<arma::Mat<double>,_arma::op_htrans> *)&ans);
  LinearAlgebra::solve(&yt_Rinv,&LX,&S_2);
  LinearAlgebra::solve((mat *)&gradR,(mat *)local_1438,&yt_Rinv);
  Q_output._0_8_ = &Rinv_X;
  Q_output._8_8_ = &gradR;
  arma::Mat<double>::Mat<arma::Mat<double>,arma::Mat<double>,arma::glue_times>
            (&Rinv_X_Xt_Rinv_X_inv_Xt_Rinv,
             (Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times> *)&Q_output);
  arma::Mat<double>::~Mat((Mat<double> *)&gradR);
  arma::Mat<double>::~Mat(&yt_Rinv);
  arma::Mat<double>::~Mat(&S_2);
  arma::Mat<double>::~Mat((Mat<double> *)local_1438);
  local_1438._0_8_ = &m.L;
  S_2._8_8_ = &m.ystar;
  gradR._0_8_ = &S_2;
  S_2._0_8_ = (Mat<double> *)local_1438;
  arma::Mat<double>::
  Mat<arma::Glue<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Mat<double>,arma::glue_solve_gen_default>,arma::op_htrans>
            (&yt_Rinv,(Op<arma::Glue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_solve_gen_default>,_arma::op_htrans>
                       *)&gradR);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1508,"YtRi = Yt \\ Tt",(allocator<char> *)&gradR);
  tVar9 = Bench::toc(bench,&local_1508,tVar9);
  std::__cxx11::string::~string((string *)&local_1508);
  pvVar1 = &this->m_y;
  ans.super_Mat<double>._0_8_ = &yt_Rinv;
  Q_output._0_8_ = &Wb_k;
  Wb_k._8_8_ = &Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
  Wb_k._0_8_ = (Mat<double> *)local_1438;
  local_1438._0_8_ = pvVar1;
  ans.super_Mat<double>._8_8_ = pvVar1;
  Q_output._8_8_ = pvVar1;
  arma::Mat<double>::Mat<arma::Mat<double>,arma::Col<double>,arma::glue_times>
            ((Mat<double> *)&gradR,
             (Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *)&ans);
  arma::Mat<double>::
  Mat<arma::Glue<arma::Op<arma::Col<double>,arma::op_htrans>,arma::Mat<double>,arma::glue_times>,arma::Col<double>,arma::glue_times>
            ((Mat<double> *)(gradR.mem_local + 6),
             (Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>
              *)&Q_output);
  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (gradR._0_8_ & 0xffffffff);
  if (gradR.n_rows == 1) {
    arma::Mat<double>::
    Mat<arma::Glue<arma::Mat<double>,arma::Col<double>,arma::glue_times>,arma::Glue<arma::Glue<arma::Op<arma::Col<double>,arma::op_htrans>,arma::Mat<double>,arma::glue_times>,arma::Col<double>,arma::glue_times>,arma::eglue_minus>
              (&S_2,(eGlue<arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>,_arma::Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Mat<double>,_arma::glue_times>,_arma::Col<double>,_arma::glue_times>,_arma::eglue_minus>
                     *)&gradR);
    arma::Mat<double>::~Mat((Mat<double> *)(gradR.mem_local + 6));
    arma::Mat<double>::~Mat((Mat<double> *)&gradR);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1528,"S2 = YtRi * y - yt * RiFFtRiFiFtRi * y",
               (allocator<char> *)&gradR);
    tVar9 = Bench::toc(bench,&local_1528,tVar9);
    std::__cxx11::string::~string((string *)&local_1528);
    if (this->m_est_sigma2 == true) {
      arma::arma_check_bounds<char[37]>
                (S_2.n_cols == 0 || S_2.n_rows == 0,
                 (char (*) [37])"Mat::operator(): index out of bounds");
      dVar18 = (double)(uVar8 - uVar11);
      dVar2 = *S_2.mem / dVar18;
    }
    else {
      dVar2 = this->m_sigma2;
      dVar18 = (double)(uVar8 - uVar11);
    }
    dVar3 = log(dVar2 * dVar18);
    CL.super_Mat<double>.n_elem = 0;
    CL.super_Mat<double>.n_alloc = 0;
    gradR._0_8_ = (Op<arma::Mat<double>,_arma::op_htrans> *)&CL;
    CL.super_Mat<double>._0_8_ = &m.L;
    rVar4 = arma::accu<arma::eOp<arma::diagview<double>,arma::eop_log>>
                      ((eOp<arma::diagview<double>,_arma::eop_log> *)&gradR);
    ans.super_Mat<double>._0_8_ = &LX;
    ans.super_Mat<double>.n_elem = 0;
    ans.super_Mat<double>.n_alloc = 0;
    local_1438._0_8_ = (Cube<double> *)&ans;
    rVar5 = arma::accu<arma::eOp<arma::diagview<double>,arma::eop_log>>
                      ((eOp<arma::diagview<double>,_arma::eop_log> *)local_1438);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1548,"lml = -Sum(log(diag(T))) - Sum(log(diag(TF)))...",
               (allocator<char> *)&gradR);
    tVar9 = Bench::toc(bench,&local_1548,tVar9);
    std::__cxx11::string::~string((string *)&local_1548);
    dVar19 = 1.0 / (double)uVar13;
    dVar6 = pow((double)uVar8,dVar19);
    Q_output.mem._0_4_ = 0;
    Q_output.mem_local[0]._0_4_ = 0;
    Wb_k.mem = (double *)((ulong)Wb_k.mem._4_4_ << 0x20);
    Wb_k.mem_local[0]._0_4_ = 0;
    Wb_k._0_8_ = &this->m_X;
    Q_output._0_8_ = &this->m_X;
    arma::Mat<double>::Mat<arma::Mat<double>,arma::op_max>
              ((Mat<double> *)local_1438,(Op<arma::Mat<double>,_arma::op_max> *)&Q_output);
    arma::Mat<double>::Mat<arma::Mat<double>,arma::op_min>
              ((Mat<double> *)(local_1418 + 0x90),(Op<arma::Mat<double>,_arma::op_min> *)&Wb_k);
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (local_1438._0_8_ & 0xffffffff);
    A_n_rows = local_1438._4_4_;
    uVar11 = local_1418._144_4_;
    if ((local_1438._0_4_ != local_1418._144_4_) || (local_1438._4_4_ != local_1384))
    goto LAB_00135ccd;
    ans.super_Mat<double>._0_8_ = (Mat<double> *)local_1438;
    dVar19 = pow((double)uVar8,dVar19);
    arma::
    Proxy_xtrans_default<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>_>
    ::Proxy_xtrans_default
              ((Proxy_xtrans_default<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>_>
                *)&gradR,
               (Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>
                *)&ans);
    gradR.mem_local[0x24] = dVar19;
    arma::Col<double>::
    Col<arma::eOp<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,arma::op_max>,arma::Op<arma::Mat<double>,arma::op_min>,arma::eglue_minus>,arma::op_htrans>,arma::eop_scalar_div_post>>
              (&CL,(Base<double,_arma::eOp<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>,_arma::eop_scalar_div_post>_>
                    *)&gradR);
    arma::
    Proxy_xtrans_default<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>_>
    ::~Proxy_xtrans_default
              ((Proxy_xtrans_default<arma::Op<arma::eGlue<arma::Op<arma::Mat<double>,_arma::op_max>,_arma::Op<arma::Mat<double>,_arma::op_min>,_arma::eglue_minus>,_arma::op_htrans>_>
                *)&gradR);
    arma::Mat<double>::~Mat((Mat<double> *)(local_1418 + 0x90));
    arma::Mat<double>::~Mat((Mat<double> *)local_1438);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1568,"CL = (max(X) - min(X)) / n^1/d",(allocator<char> *)&gradR);
    Bench::toc(bench,&local_1568,tVar9);
    std::__cxx11::string::~string((string *)&local_1568);
    local_1438._0_8_ = &CL;
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (CL.super_Mat<double>._0_8_ & 0xffffffff);
    uVar11 = (_theta->super_Mat<double>).n_rows;
    local_1428 = &_theta->super_Mat<double>;
    if (CL.super_Mat<double>.n_rows != uVar11) goto LAB_00135cee;
    __x = (Mat<double> *)
          arma::accu<arma::eGlue<arma::Col<double>,arma::Col<double>,arma::eglue_div>>
                    ((eGlue<arma::Col<double>,_arma::Col<double>,_arma::eglue_div> *)local_1438);
    dVar18 = dVar18 * -0.5 * dVar3 + (-rVar4 - rVar5);
    pMVar20 = (Mat<double> *)(((double)uVar13 + 0.2) * (1.0 / dVar6));
    dVar3 = log((double)__x);
    dVar3 = dVar3 * 0.2 - (double)__x * (double)pMVar20;
    if (grad_out == (vec *)0x0) {
LAB_00135bf1:
      arma::Mat<double>::~Mat(&CL.super_Mat<double>);
      arma::Mat<double>::~Mat(&S_2);
      arma::Mat<double>::~Mat(&yt_Rinv);
      arma::Mat<double>::~Mat(&Rinv_X_Xt_Rinv_X_inv_Xt_Rinv);
      arma::Mat<double>::~Mat(&LX);
      arma::Mat<double>::~Mat(&Xt_Rinv_X);
      arma::Mat<double>::~Mat(&Rinv_X);
      KModel::~KModel(&m);
      return dVar18 + dVar3;
    }
    if (this->m_est_sigma2 != true) {
      arma::Col<double>::Col<arma::fill::fill_zeros>
                ((Col<double> *)&gradR,uVar12,
                 (fill_class<arma::fill::fill_zeros> *)&arma::fill::zeros);
      arma::Col<double>::operator=(grad_out,(Col<double> *)&gradR);
      arma::Mat<double>::~Mat((Mat<double> *)&gradR);
      for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
        arma::Col<double>::Col((Col<double> *)&gradR,_theta);
        gradR.mem[uVar15] = gradR.mem[uVar15] + 1e-06;
        dVar2 = _logMargPost(this,(vec *)&gradR,(vec *)0x0,(KModel *)0x0,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                              *)0x0);
        (grad_out->super_Mat<double>).mem[uVar15] = (dVar2 - (dVar18 + dVar3)) / 1e-06;
        arma::Mat<double>::~Mat((Mat<double> *)&gradR);
      }
      goto LAB_00135bf1;
    }
    tVar9 = Bench::tic();
    arma::Col<double>::Col<arma::fill::fill_none>
              (&ans,uVar12,(fill_class<arma::fill::fill_none> *)&arma::fill::none);
    local_1438._0_8_ = &yt_Rinv;
    gradR_k._0_8_ = &Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
    gradR_k._8_8_ = pvVar1;
    arma::Proxy_xtrans_default<arma::Op<arma::Mat<double>,_arma::op_htrans>_>::Proxy_xtrans_default
              ((Proxy_xtrans_default<arma::Op<arma::Mat<double>,_arma::op_htrans>_> *)&gradR,
               (Op<arma::Mat<double>,_arma::op_htrans> *)local_1438);
    arma::Mat<double>::Mat<arma::Mat<double>,arma::Col<double>,arma::glue_times>
              ((Mat<double> *)(gradR.mem_local + 0x10),
               (Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times> *)&gradR_k);
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (ulong)gradR.mem_local[10]._0_4_;
    uVar11 = gradR.mem_local[0x10]._0_4_;
    if ((gradR.mem_local[0xc]._0_4_ != 1) ||
       (gradR.mem_local[10]._0_4_ != gradR.mem_local[0x10]._0_4_)) goto LAB_00135d15;
    arma::Mat<double>::
    Mat<arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Glue<arma::Mat<double>,arma::Col<double>,arma::glue_times>,arma::eglue_minus>
              (&Q_output,
               (eGlue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Glue<arma::Mat<double>,_arma::Col<double>,_arma::glue_times>,_arma::eglue_minus>
                *)&gradR);
    arma::Mat<double>::~Mat((Mat<double> *)(gradR.mem_local + 0x10));
    arma::Mat<double>::~Mat((Mat<double> *)&gradR.mem);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1588,"Qo = YtRi - RiFFtRiFiFtRi * y",(allocator<char> *)&gradR);
    tVar9 = Bench::toc(bench,&local_1588,tVar9);
    std::__cxx11::string::~string((string *)&local_1588);
    arma::Cube<double>::Cube<arma::fill::fill_zeros>
              (&gradR,uVar8,uVar8,uVar12,(fill_class<arma::fill::fill_zeros> *)&arma::fill::zeros);
    iVar10 = 0;
    for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
      for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
        dVar6 = m.R.mem[m.R.n_rows * uVar16 + uVar12];
        uVar17 = iVar10 + uVar16;
        arma::arma_check_bounds<char[32]>
                  ((this->m_dX).n_cols <= uVar17,(char (*) [32])"Mat::col(): index out of bounds");
        local_1288._24_4_ = (this->m_dX).n_rows;
        local_1288._8_4_ = 0;
        local_1288._20_4_ = 1;
        local_1288._16_4_ = local_1288._24_4_;
        local_1288._32_8_ = (this->m_dX).mem + local_1288._24_4_ * uVar17;
        local_1288._0_8_ = &this->m_dX;
        local_1288._12_4_ = uVar17;
        arma::Col<double>::Col<arma::subview<double>>
                  ((Col<double> *)&Wb_k,(Base<double,_arma::subview<double>_> *)local_1288);
        std::function<arma::Col<double>_(const_arma::Col<double>_&,_const_arma::Col<double>_&)>::
        operator()((Col<double> *)local_1438,&this->_DlnCovDtheta,(Col<double> *)&Wb_k,_theta);
        gradR_k._0_8_ = (Mat<double> *)local_1438;
        gradR_k._16_8_ = dVar6;
        arma::arma_check_bounds<char[36]>
                  (gradR.n_cols <= uVar16 || gradR.n_rows <= uVar12,
                   (char (*) [36])"Cube::tube(): indices out of bounds");
        stack0xffffffffffffeb20 = (double)CONCAT44(uVar16,uVar12);
        local_14d8 = 2.12199579096527e-314;
        dStack_14d0 = 2.12199579145934e-314;
        local_14c8 = gradR.n_slices;
        local_14c4 = gradR.n_slices;
        local_14e8._0_8_ = &gradR;
        arma::subview_cube<double>::operator=
                  ((subview_cube<double> *)local_14e8,
                   (Base<double,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>_> *)&gradR_k);
        arma::Mat<double>::~Mat((Mat<double> *)local_1438);
        arma::Mat<double>::~Mat(&Wb_k);
        arma::arma_check_bounds<char[36]>
                  (gradR.n_cols <= uVar16 || gradR.n_rows <= uVar12,
                   (char (*) [36])"Cube::tube(): indices out of bounds");
        stack0xffffffffffffebd0 = (mat *)CONCAT44(uVar16,uVar12);
        local_1428 = (Mat<double> *)0x100000000;
        uStack_1420 = 0x100000001;
        local_1418._0_4_ = gradR.n_slices;
        local_1418._4_4_ = gradR.n_slices;
        local_1438._0_8_ = &gradR;
        arma::arma_check_bounds<char[36]>
                  (gradR.n_cols <= uVar12 || gradR.n_rows <= uVar16,
                   (char (*) [36])"Cube::tube(): indices out of bounds");
        Wb_k.n_alloc = uVar12;
        Wb_k.n_elem = uVar16;
        Wb_k.vec_state = 0;
        Wb_k.mem_state = 0;
        Wb_k._20_4_ = 1;
        Wb_k._24_8_ = 0x100000001;
        Wb_k.mem = (double *)CONCAT44(gradR.n_slices,gradR.n_slices);
        Wb_k._0_8_ = &gradR;
        arma::subview_cube<double>::operator=
                  ((subview_cube<double> *)&Wb_k,(subview_cube<double> *)local_1438);
      }
      iVar10 = iVar10 + uVar8;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15a8,"gradR = R * dlnCov(dX)",(allocator<char> *)local_1438);
    Bench::toc(bench,&local_15a8,tVar9);
    std::__cxx11::string::~string((string *)&local_15a8);
    Wb_k.mem = (double *)0x0;
    Wb_k.n_rows = 0;
    Wb_k.n_cols = 0;
    Wb_k.n_elem = 0;
    Wb_k.n_alloc = 0;
    Wb_k._16_8_ = Wb_k._16_8_ & 0xffffffff00000000;
    uVar15 = 0;
    while( true ) {
      if (uVar13 == uVar15) break;
      tVar9 = Bench::tic();
      in_mat = arma::Cube<double>::slice(&gradR,(uword)uVar15);
      arma::Mat<double>::Mat(&gradR_k,in_mat);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1128,"gradR_k = gradR[k]",(allocator<char> *)local_1438);
      tVar9 = Bench::toc(bench,&local_1128,tVar9);
      std::__cxx11::string::~string((string *)&local_1128);
      local_dd8.m = &m.L;
      arma::Mat<double>::Mat<arma::Mat<double>,arma::op_htrans>
                ((Mat<double> *)local_14e8,&local_dd8);
      LinearAlgebra::solve((mat *)local_ca8,&m.L,&gradR_k);
      LinearAlgebra::solve((mat *)local_1288,(mat *)local_14e8,(mat *)local_ca8);
      local_15c0.A = &gradR_k;
      local_15c0.B = &Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
      local_1628._0_8_ =
           (eGlue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::eglue_minus>
            *)local_1288;
      arma::Proxy_xtrans_default<arma::Op<arma::Mat<double>,_arma::op_htrans>_>::
      Proxy_xtrans_default
                ((Proxy_xtrans_default<arma::Op<arma::Mat<double>,_arma::op_htrans>_> *)local_1438,
                 (Op<arma::Mat<double>,_arma::op_htrans> *)local_1628);
      arma::Mat<double>::Mat<arma::Mat<double>,arma::Mat<double>,arma::glue_times>
                (&local_1338,&local_15c0);
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)local_1368;
      if ((local_1368 != local_1338.n_rows) || (local_1358 != local_1338.n_cols)) {
        arma::arma_incompat_size_string_abi_cxx11_
                  ((string *)local_15e8,(arma *)pbVar14,local_1358,local_1338.n_rows,
                   local_1338.n_cols,0x1853b1,in_stack_ffffffffffffe888);
        arma::arma_stop_logic_error<std::__cxx11::string>((arma *)local_15e8,pbVar14);
        goto LAB_00135ca4;
      }
      arma::Mat<double>::operator=
                (&Wb_k,(eGlue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::eglue_minus>
                        *)local_1438);
      arma::Mat<double>::~Mat(&local_1338);
      arma::Mat<double>::~Mat((Mat<double> *)local_1418);
      arma::Mat<double>::~Mat((Mat<double> *)local_1288);
      arma::Mat<double>::~Mat((mat *)local_ca8);
      arma::Mat<double>::~Mat((Mat<double> *)local_14e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cc8,"Wb_k = gradR_k \\ L \\ Tt - gradR_k * RiFFtRiFiFtRi",
                 (allocator<char> *)local_1438);
      tVar9 = Bench::toc(bench,&local_cc8,tVar9);
      std::__cxx11::string::~string((string *)&local_cc8);
      uVar11 = Wb_k.n_rows;
      if (Wb_k.n_cols < Wb_k.n_rows) {
        uVar11 = Wb_k.n_cols;
      }
      stack0xffffffffffffeb20 = 0.0;
      local_14d8 = (double)CONCAT44(uVar11,uVar11);
      local_14e8._0_8_ = (Cube<double> *)&Wb_k;
      rVar4 = arma::accu<arma::diagview<double>>((diagview<double> *)local_14e8);
      local_1628._8_8_ = local_1288;
      local_ca8._0_8_ = local_1628;
      local_ca8._8_8_ = &Q_output;
      local_1628._0_8_ =
           (eGlue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::eglue_minus>
            *)local_1438;
      local_1438._0_8_ = pvVar1;
      local_1288._0_8_ = (Cube<double> *)&Wb_k;
      eVar7 = arma::as_scalar_redirect<3u>::
              apply<arma::Op<arma::Col<double>,arma::op_htrans>,arma::Op<arma::Mat<double>,arma::op_htrans>,arma::Mat<double>>
                        ((Glue<arma::Glue<arma::Op<arma::Col<double>,_arma::op_htrans>,_arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::glue_times>,_arma::Mat<double>,_arma::glue_times>
                          *)local_ca8);
      ans.super_Mat<double>.mem[uVar15] = eVar7 / (dVar2 + dVar2) + rVar4 * -0.5;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ce8,"ans[k] = Sum(diag(Wb_k)) + yt * Wb_kt * Qo / S2...",
                 (allocator<char> *)local_1438);
      Bench::toc(bench,&local_ce8,tVar9);
      std::__cxx11::string::~string((string *)&local_ce8);
      arma::Mat<double>::~Mat(&gradR_k);
      uVar15 = uVar15 + 1;
    }
    local_1288._0_8_ = &CL;
    gradR_k.vec_state = 0x999a;
    gradR_k.mem_state = 0x9999;
    gradR_k._20_4_ = 0x3fc99999;
    local_1438._0_8_ = &gradR_k;
    local_dd8.m = (Mat<double> *)local_15e8;
    local_dd8.aux = (elem_type)local_14e8;
    uVar11 = (_theta->super_Mat<double>).n_rows;
    uVar8 = CL.super_Mat<double>.n_rows;
    local_15e8._0_8_ =
         (eGlue<arma::Op<arma::Mat<double>,_arma::op_htrans>,_arma::Glue<arma::Mat<double>,_arma::Mat<double>,_arma::glue_times>,_arma::eglue_minus>
          *)local_1438;
    local_15e8._16_8_ = local_1288;
    local_14e8._0_8_ = _theta;
    local_1428 = __x;
    local_1288._16_8_ = pMVar20;
    gradR_k._0_8_ = local_1288._0_8_;
    if (CL.super_Mat<double>.n_rows == uVar11) {
      local_1628._0_8_ = &ans;
      local_1618 = &local_dd8;
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ans.super_Mat<double>._0_8_ & 0xffffffff);
      uVar11 = CL.super_Mat<double>.n_rows;
      if (ans.super_Mat<double>.n_rows == CL.super_Mat<double>.n_rows) {
        arma::Mat<double>::operator=
                  (&grad_out->super_Mat<double>,
                   (eGlue<arma::Col<double>,_arma::eGlue<arma::eGlue<arma::eOp<arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eop_scalar_div_post>,_arma::eOp<arma::Col<double>,_arma::eop_scalar_times>,_arma::eglue_minus>,_arma::eOp<arma::Col<double>,_arma::eop_square>,_arma::eglue_div>,_arma::eglue_minus>
                    *)local_1628);
        arma::Mat<double>::~Mat(&Wb_k);
        arma::Cube<double>::~Cube(&gradR);
        arma::Mat<double>::~Mat(&Q_output);
        arma::Mat<double>::~Mat(&ans.super_Mat<double>);
        goto LAB_00135bf1;
      }
      goto LAB_00135d63;
    }
  }
  else {
LAB_00135ca4:
    local_1384 = 1;
    uVar11 = local_1384;
    arma::arma_incompat_size_string_abi_cxx11_
              ((string *)&CL,(arma *)pbVar14,1,1,1,0x1853b1,in_stack_ffffffffffffe888);
    arma::arma_stop_logic_error<std::__cxx11::string>((arma *)&CL,pbVar14);
    A_n_rows = extraout_EDX;
LAB_00135ccd:
    arma::arma_incompat_size_string_abi_cxx11_
              ((string *)&gradR_k,(arma *)pbVar14,A_n_rows,uVar11,local_1384,0x1853b1,
               in_stack_ffffffffffffe888);
    arma::arma_stop_logic_error<std::__cxx11::string>((arma *)&gradR_k,pbVar14);
LAB_00135cee:
    arma::arma_incompat_size_string_abi_cxx11_
              ((string *)&gradR,(arma *)pbVar14,1,uVar11,1,0x186470,in_stack_ffffffffffffe888);
    arma::arma_stop_logic_error<std::__cxx11::string>((arma *)&gradR,pbVar14);
    gradR.mem_local[0xc]._0_4_ = extraout_EDX_00;
LAB_00135d15:
    arma::arma_incompat_size_string_abi_cxx11_
              ((string *)&Wb_k,(arma *)pbVar14,gradR.mem_local[0xc]._0_4_,uVar11,1,0x1853b1,
               in_stack_ffffffffffffe888);
    arma::arma_stop_logic_error<std::__cxx11::string>((arma *)&Wb_k,pbVar14);
    uVar8 = extraout_EAX;
  }
  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar8;
  arma::arma_incompat_size_string_abi_cxx11_
            ((string *)local_ca8,(arma *)pbVar14,1,uVar11,1,0x186470,in_stack_ffffffffffffe888);
  arma::arma_stop_logic_error<std::__cxx11::string>((arma *)local_ca8,pbVar14);
  uVar11 = extraout_EAX_00;
LAB_00135d63:
  arma::arma_incompat_size_string_abi_cxx11_
            ((string *)local_ca8,(arma *)pbVar14,1,uVar11,1,0x1853b1,in_stack_ffffffffffffe888);
  arma::arma_stop_logic_error<std::__cxx11::string>((arma *)local_ca8,pbVar14);
  std::__cxx11::string::~string((string *)local_ca8);
  arma::Mat<double>::~Mat(&Wb_k);
  arma::Cube<double>::~Cube(&gradR);
  arma::Mat<double>::~Mat(&Q_output);
  arma::Mat<double>::~Mat(&ans.super_Mat<double>);
  arma::Mat<double>::~Mat(&CL.super_Mat<double>);
  arma::Mat<double>::~Mat(&S_2);
  arma::Mat<double>::~Mat(&yt_Rinv);
  arma::Mat<double>::~Mat(&Rinv_X_Xt_Rinv_X_inv_Xt_Rinv);
  arma::Mat<double>::~Mat(&LX);
  arma::Mat<double>::~Mat(&Xt_Rinv_X);
  arma::Mat<double>::~Mat(&Rinv_X);
  KModel::~KModel(&m);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

double Kriging::_logMargPost(const arma::vec& _theta,
                             arma::vec* grad_out,
                             Kriging::KModel* model,
                             std::map<std::string, double>* bench) const {
  // arma::cout << " theta: " << _theta << arma::endl;

  // In RobustGaSP:
  // neg_log_marginal_post_approx_ref <- function(param,nugget,
  // nugget.est,R0,X,zero_mean,output,CL,a,b,kernel_type,alpha) {
  //  lml=log_marginal_lik(param,nugget,nugget.est,R0,X,zero_mean,output,kernel_type,alpha);
  //  lp=log_approx_ref_prior(param,nugget,nugget.est,CL,a,b);
  //  -(lml+lp)
  //}
  // double log_marginal_lik(const Vec param,double nugget, const bool nugget_est, const List R0, const
  // Eigen::Map<Eigen::MatrixXd>  &X,const String zero_mean,const Eigen::Map<Eigen::MatrixXd>  &output, Eigen::VectorXi
  // kernel_type,const Eigen::VectorXd alpha ){
  //  double nu=nugget;
  //  int param_size=param.size();
  //  Eigen::VectorXd beta= param.array().exp().matrix();
  //  ...beta
  //  R=R+nu*MatrixXd::Identity(num_obs,num_obs);  //not sure
  //
  //  LLT<MatrixXd> lltOfR(R);             // compute the cholesky decomposition of R called lltofR
  //  MatrixXd L = lltOfR.matrixL();   //retrieve factor L  in the decomposition
  //
  //  if(zero_mean=="Yes"){...}else{
  //
  //  int q=X.cols();
  //
  //  MatrixXd Rinv_X=L.transpose().triangularView<Upper>().solve(L.triangularView<Lower>().solve(X)); //one forward
  //  and one backward to compute R.inv%*%X MatrixXd Xt_Rinv_X=X.transpose()*Rinv_X; //Xt%*%R.inv%*%X
  //
  //  LLT<MatrixXd> lltOfXRinvX(Xt_Rinv_X); // cholesky decomposition of Xt_Rinv_X called lltOfXRinvX
  //  MatrixXd LX = lltOfXRinvX.matrixL();  //  retrieve factor LX  in the decomposition
  //  MatrixXd Rinv_X_Xt_Rinv_X_inv_Xt_Rinv=
  //  Rinv_X*(LX.transpose().triangularView<Upper>().solve(LX.triangularView<Lower>().solve(Rinv_X.transpose())));
  //  //compute  Rinv_X_Xt_Rinv_X_inv_Xt_Rinv through one forward and one backward solve MatrixXd yt_Rinv=
  //  (L.transpose().triangularView<Upper>().solve(L.triangularView<Lower>().solve(output))).transpose(); MatrixXd S_2=
  //  (yt_Rinv*output-output.transpose()*Rinv_X_Xt_Rinv_X_inv_Xt_Rinv*output); double log_S_2=log(S_2(0,0)); return
  //  (-(L.diagonal().array().log().matrix().sum())-(LX.diagonal().array().log().matrix().sum())-(num_obs-q)/2.0*log_S_2);
  //  }
  //}
  // double log_approx_ref_prior(const Vec param,double nugget, bool nugget_est, const Eigen::VectorXd CL,const double
  // a,const double b ){
  //  double nu=nugget;
  //  int param_size=param.size();beta
  //  Eigen::VectorX beta= param.array().exp().matrix();
  //  ...
  //  double t=CL.cwiseProduct(beta).sum()+nu;
  //  return -b*t + a*log(t);
  //}

  Kriging::KModel m = make_Model(_theta, bench);
  if (model != nullptr)
    *model = m;

  arma::uword n = m_X.n_rows;
  arma::uword d = m_X.n_cols;
  arma::uword p = m_F.n_cols;

  // RobustGaSP naming...
  // arma::mat X = m_F;
  // arma::mat L = fd->T;

  auto t0 = Bench::tic();
  // m.Fstar : fd->M = solve(L, X, LinearAlgebra::default_solve_opts);

  // arma::mat Rinv_X = solve(trans(L), fd->M, LinearAlgebra::default_solve_opts);
  arma::mat Rinv_X = LinearAlgebra::solve(m.L.t(), m.Fstar);

  // arma::mat Xt_Rinv_X = trans(X) * Rinv_X;  // Xt%*%R.inv%*%X
  arma::mat Xt_Rinv_X = m_F.t() * Rinv_X;

  // arma::mat LX = chol(Xt_Rinv_X, "lower");  //  retrieve factor LX  in the decomposition
  arma::mat LX = LinearAlgebra::safe_chol_lower(Xt_Rinv_X);

  // arma::mat Rinv_X_Xt_Rinv_X_inv_Xt_Rinv
  //     = Rinv_X
  //       * (solve(trans(LX),
  //                solve(LX, trans(Rinv_X), LinearAlgebra::default_solve_opts),
  //                LinearAlgebra::default_solve_opts));  // compute  Rinv_X_Xt_Rinv_X_inv_Xt_Rinv through one forward
  arma::mat Rinv_X_Xt_Rinv_X_inv_Xt_Rinv
      = Rinv_X
        * (LinearAlgebra::solve(
            trans(LX),
            LinearAlgebra::solve(LX, trans(Rinv_X))));  // compute  Rinv_X_Xt_Rinv_X_inv_Xt_Rinv through one forward

  arma::mat yt_Rinv = trans(solve(trans(m.L), m.ystar));
  t0 = Bench::toc(bench, "YtRi = Yt \\ Tt", t0);

  arma::mat S_2 = (yt_Rinv * m_y - trans(m_y) * Rinv_X_Xt_Rinv_X_inv_Xt_Rinv * m_y);
  t0 = Bench::toc(bench, "S2 = YtRi * y - yt * RiFFtRiFiFtRi * y", t0);

  double sigma2;
  if (m_est_sigma2) {
    sigma2 = S_2(0, 0) / (n - p);
  } else {
    sigma2 = m_sigma2;
  }
  double log_S_2 = log(sigma2 * (n - p));

  double log_marginal_lik = -sum(log(m.L.diag())) - sum(log(LX.diag())) - (n - p) / 2.0 * log_S_2;
  t0 = Bench::toc(bench, "lml = -Sum(log(diag(T))) - Sum(log(diag(TF)))...", t0);
  // arma::cout << " log_marginal_lik:" << log_marginal_lik << arma::endl;

  // Default prior params
  double a = 0.2;
  double b = 1.0 / pow(n, 1.0 / d) * (a + d);
  // t0 = Bench::toc(bench,"b             ", t0);

  arma::vec CL = trans(max(m_X, 0) - min(m_X, 0)) / pow(n, 1.0 / d);
  t0 = Bench::toc(bench, "CL = (max(X) - min(X)) / n^1/d", t0);

  double t = arma::accu(CL / _theta);
  // arma::cout << " a:" << a << arma::endl;
  // arma::cout << " b:" << b << arma::endl;
  // arma::cout << " t:" << t << arma::endl;

  double log_approx_ref_prior = -b * t + a * log(t);
  // arma::cout << " log_approx_ref_prior:" << log_approx_ref_prior << arma::endl;

  if (grad_out != nullptr) {
    // Eigen::VectorXd log_marginal_lik_deriv(const Eigen::VectorXd param,double nugget,  bool nugget_est, const List
    // R0, const Eigen::Map<Eigen::MatrixXd>  &X,const String zero_mean,const Eigen::Map<Eigen::MatrixXd>  &output,
    // Eigen::VectorXi kernel_type,const Eigen::VectorXd alpha){
    // ...
    // VectorXd ans=VectorXd::Ones(param_size);
    // ...
    // MatrixXd Q_output= yt_Rinv.transpose()-Rinv_X_Xt_Rinv_X_inv_Xt_Rinv*output;
    // MatrixXd dev_R_i;
    // MatrixXd Wb_ti;
    // //allow different choices of kernels
    //
    // for(int ti=0;ti<p;ti++){
    //   //kernel_type_ti=kernel_type[ti];
    //   if(kernel_type[ti]==3){
    //     dev_R_i=matern_5_2_deriv( R0[ti],R_ori,beta[ti]);  //now here I have R_ori instead of R
    //   }else {...}
    //   Wb_ti=(L.transpose().triangularView<Upper>().solve(L.triangularView<Lower>().solve(dev_R_i))).transpose()-dev_R_i*Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
    //   ans[ti]=-0.5*Wb_ti.diagonal().sum()+(num_obs-q)/2.0*(output.transpose()*Wb_ti.transpose()*Q_output/S_2(0,0))(0,0);
    // }

    if (m_est_sigma2) {
      t0 = Bench::tic();
      arma::vec ans = arma::vec(d, arma::fill::none);
      arma::mat Q_output = trans(yt_Rinv) - Rinv_X_Xt_Rinv_X_inv_Xt_Rinv * m_y;
      t0 = Bench::toc(bench, "Qo = YtRi - RiFFtRiFiFtRi * y", t0);

      arma::cube gradR = arma::cube(n, n, d, arma::fill::zeros);
      // const arma::vec zeros = arma::vec(d,arma::fill::zeros);
      for (arma::uword i = 0; i < n; i++) {
        // gradR.tube(i, i) = zeros;
        for (arma::uword j = 0; j < i; j++) {
          gradR.tube(i, j) = m.R.at(i, j) * _DlnCovDtheta(m_dX.col(i * n + j), _theta);
          gradR.tube(j, i) = gradR.tube(i, j);
        }
      }
      t0 = Bench::toc(bench, "gradR = R * dlnCov(dX)", t0);

      arma::mat Wb_k;
      for (arma::uword k = 0; k < d; k++) {
        t0 = Bench::tic();
        arma::mat gradR_k = gradR.slice(k);
        t0 = Bench::toc(bench, "gradR_k = gradR[k]", t0);

        Wb_k = trans(LinearAlgebra::solve(trans(m.L), LinearAlgebra::solve(m.L, gradR_k)))
               - gradR_k * Rinv_X_Xt_Rinv_X_inv_Xt_Rinv;
        t0 = Bench::toc(bench, "Wb_k = gradR_k \\ L \\ Tt - gradR_k * RiFFtRiFiFtRi", t0);

        ans[k] = -sum(Wb_k.diag()) / 2.0 + as_scalar(trans(m_y) * trans(Wb_k) * Q_output) / (2.0 * sigma2);
        t0 = Bench::toc(bench, "ans[k] = Sum(diag(Wb_k)) + yt * Wb_kt * Qo / S2...", t0);
      }
      // arma::cout << " log_marginal_lik_deriv:" << ans << arma::endl;
      // arma::cout << " log_approx_ref_prior_deriv:" <<  - (a * CL / t - b * CL) / pow(_theta, 2.0) << arma::endl;

      *grad_out = ans - (a * CL / t - b * CL) / square(_theta);
      // t0 = Bench::toc(bench," grad_out     ", t0);
    } else {  // TODO: we do not have (yet) formula when sigma2 is fixed... :(
      *grad_out = arma::vec(d, arma::fill::zeros);
      double _eps = 1e-6;
      for (arma::uword k = 0; k < d; k++) {
        arma::vec theta_eps = _theta;
        theta_eps[k] += _eps;
        (*grad_out)[k]
            = (_logMargPost(theta_eps, nullptr, nullptr, nullptr) - (log_marginal_lik + log_approx_ref_prior)) / _eps;
      }
    }
    // arma::cout << " grad_out:" << *grad_out << arma::endl;
  }

  // arma::cout << " lmp:" << (log_marginal_lik+log_approx_ref_prior) << arma::endl;
  return (log_marginal_lik + log_approx_ref_prior);
}